

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O2

void opj_tgt_setvalue(opj_tgt_tree_t *tree,OPJ_UINT32 leafno,OPJ_INT32 value)

{
  opj_tgt_node *poVar1;
  
  for (poVar1 = tree->nodes + leafno; (poVar1 != (opj_tgt_node_t *)0x0 && (value < poVar1->value));
      poVar1 = poVar1->parent) {
    poVar1->value = value;
  }
  return;
}

Assistant:

void opj_tgt_setvalue(opj_tgt_tree_t *tree, OPJ_UINT32 leafno, OPJ_INT32 value)
{
    opj_tgt_node_t *node;
    node = &tree->nodes[leafno];
    while (node && node->value > value) {
        node->value = value;
        node = node->parent;
    }
}